

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O0

void init_crc16_tab(void)

{
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  uint16_t c;
  uint16_t crc;
  uint16_t j;
  uint16_t i;
  
  for (local_a = 0; local_a < 0x100; local_a = local_a + 1) {
    local_e = 0;
    local_10 = local_a;
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      if (((local_e ^ local_10) & 1) == 0) {
        local_e = (ushort)((int)(uint)local_e >> 1);
      }
      else {
        local_e = (ushort)((int)(uint)local_e >> 1) ^ 0xa001;
      }
      local_10 = (ushort)((int)(uint)local_10 >> 1);
    }
    crc_tab16[local_a] = local_e;
  }
  crc_tab16_init = true;
  return;
}

Assistant:

static void init_crc16_tab(void) {
  uint16_t i;
  uint16_t j;
  uint16_t crc;
  uint16_t c;

  for (i = 0; i < 256; i++) {
    crc = 0;
    c = i;

    for (j = 0; j < 8; j++) {
      if ((crc ^ c) & 0x0001)
        crc = (crc >> 1) ^ CRC_POLY_16;
      else
        crc = crc >> 1;

      c = c >> 1;
    }

    crc_tab16[i] = crc;
  }

  crc_tab16_init = true;

}